

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded.hpp
# Opt level: O2

guarded<std::pair<bool,_bool>,_std::mutex> * __thiscall
gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
          (guarded<std::pair<bool,bool>,std::mutex> *this,pair<bool,_bool> *newObj)

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 8))->__data);
  *this = (guarded<std::pair<bool,bool>,std::mutex>)newObj->first;
  this[1] = (guarded<std::pair<bool,bool>,std::mutex>)newObj->second;
  pthread_mutex_unlock((pthread_mutex_t *)(this + 8));
  return (guarded<std::pair<bool,_bool>,_std::mutex> *)this;
}

Assistant:

guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }